

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-chat.cpp
# Opt level: O0

void assert_msg_equals(common_chat_msg *expected,common_chat_msg *actual)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_00;
  parser_callback_t *cb;
  size_type sVar1;
  long in_RSI;
  long in_RDI;
  value_type *actual_tool_call;
  value_type *expected_tool_call;
  size_t i_1;
  value_type *actual_part;
  value_type *expected_part;
  size_t i;
  error_handler_t in_stack_0000017c;
  bool in_stack_00000182;
  char in_stack_00000183;
  int in_stack_00000184;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_00000188;
  nullptr_t in_stack_fffffffffffffea8;
  function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  string local_e0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_80 [32];
  const_reference local_60;
  const_reference local_58;
  ulong local_50;
  size_type local_48;
  size_type local_40;
  const_reference local_38;
  const_reference local_30;
  ulong uVar2;
  ulong __n;
  
  assert_equals<std::__cxx11::string>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  assert_equals<std::__cxx11::string>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  i_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>::
         size((vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_> *
              )(in_RDI + 0x40));
  cb = (parser_callback_t *)
       std::vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>::
       size((vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_> *)
            (in_RSI + 0x40));
  assert_equals<unsigned_long>
            ((unsigned_long *)in_stack_fffffffffffffed0,(unsigned_long *)in_stack_fffffffffffffec8);
  uVar2 = 0;
  while( true ) {
    __n = uVar2;
    sVar1 = std::vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
            ::size((vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                    *)(in_RDI + 0x40));
    if (sVar1 <= uVar2) break;
    local_30 = std::
               vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>::
               operator[]((vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                           *)(in_RDI + 0x40),__n);
    local_38 = std::
               vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>::
               operator[]((vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                           *)(in_RSI + 0x40),__n);
    assert_equals<std::__cxx11::string>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    assert_equals<std::__cxx11::string>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    uVar2 = __n + 1;
  }
  assert_equals<std::__cxx11::string>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_40 = std::vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>::size
                       ((vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_> *)
                        (in_RDI + 0x58));
  local_48 = std::vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>::size
                       ((vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_> *)
                        (in_RSI + 0x58));
  assert_equals<unsigned_long>
            ((unsigned_long *)in_stack_fffffffffffffed0,(unsigned_long *)in_stack_fffffffffffffec8);
  local_50 = 0;
  while( true ) {
    uVar2 = local_50;
    sVar1 = std::vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>::size
                      ((vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_> *)
                       (in_RDI + 0x58));
    if (sVar1 <= uVar2) break;
    local_58 = std::vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>::
               operator[]((vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_> *)
                          (in_RDI + 0x58),local_50);
    local_60 = std::vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>::
               operator[]((vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_> *)
                          (in_RSI + 0x58),local_50);
    assert_equals<std::__cxx11::string>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    in_stack_fffffffffffffec8 = &local_58->arguments;
    in_stack_fffffffffffffed0 = &local_b0;
    std::
    function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
    ::function(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::__cxx11::string_const&>(i_00,cb,SUB81(__n >> 0x38,0),SUB81(__n >> 0x30,0));
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::dump(in_stack_00000188,in_stack_00000184,in_stack_00000183,in_stack_00000182,in_stack_0000017c
          );
    in_stack_fffffffffffffeb0 =
         (function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
          *)&local_60->arguments;
    std::
    function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
    ::function(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::__cxx11::string_const&>(i_00,cb,SUB81(__n >> 0x38,0),SUB81(__n >> 0x30,0));
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::dump(in_stack_00000188,in_stack_00000184,in_stack_00000183,in_stack_00000182,in_stack_0000017c
          );
    assert_equals<std::__cxx11::string>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    std::__cxx11::string::~string(local_e0);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffeb0);
    std::
    function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
    ::~function((function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                 *)0x1766fe);
    std::__cxx11::string::~string(local_80);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffeb0);
    std::
    function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
    ::~function((function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                 *)0x176725);
    assert_equals<std::__cxx11::string>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

static void assert_msg_equals(const common_chat_msg & expected, const common_chat_msg & actual) {
    assert_equals(expected.role, actual.role);
    assert_equals(expected.content, actual.content);
    assert_equals(expected.content_parts.size(), actual.content_parts.size());
    for (size_t i = 0; i < expected.content_parts.size(); i++) {
        const auto & expected_part = expected.content_parts[i];
        const auto & actual_part   = actual.content_parts[i];
        assert_equals(expected_part.type, actual_part.type);
        assert_equals(expected_part.text, actual_part.text);
    }
    assert_equals(expected.reasoning_content, actual.reasoning_content);
    assert_equals(expected.tool_calls.size(), actual.tool_calls.size());
    for (size_t i = 0; i < expected.tool_calls.size(); i++) {
        const auto & expected_tool_call = expected.tool_calls[i];
        const auto & actual_tool_call   = actual.tool_calls[i];
        assert_equals(expected_tool_call.name, actual_tool_call.name);
        assert_equals(json::parse(expected_tool_call.arguments).dump(), json::parse(actual_tool_call.arguments).dump());
        assert_equals(expected_tool_call.id, actual_tool_call.id);
    }
}